

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

size_t gc_onestep(lua_State *L)

{
  uint uVar1;
  global_State *g_00;
  GCSize GVar2;
  GCRef *pGVar3;
  GCSize old_1;
  GCSize old;
  global_State *g;
  lua_State *L_local;
  
  g_00 = (global_State *)(L->glref).ptr64;
  switch((g_00->gc).state) {
  case '\0':
    gc_mark_start(g_00);
    L_local = (lua_State *)0x0;
    break;
  case '\x01':
    if ((g_00->gc).gray.gcptr64 == 0) {
      (g_00->gc).state = '\x02';
      L_local = (lua_State *)0x0;
    }
    else {
      L_local = (lua_State *)propagatemark(g_00);
    }
    break;
  case '\x02':
    if ((g_00->jit_base).ptr64 == 0) {
      atomic(g_00,L);
      (g_00->gc).state = '\x03';
      (g_00->gc).sweepstr = 0;
      L_local = (lua_State *)0x0;
    }
    else {
      L_local = (lua_State *)0x800000000000;
    }
    break;
  case '\x03':
    GVar2 = (g_00->gc).total;
    pGVar3 = (g_00->str).tab;
    uVar1 = (g_00->gc).sweepstr;
    (g_00->gc).sweepstr = uVar1 + 1;
    gc_sweepstr(g_00,pGVar3 + uVar1);
    if ((g_00->str).mask < (g_00->gc).sweepstr) {
      (g_00->gc).state = '\x04';
    }
    (g_00->gc).estimate = (g_00->gc).estimate - (GVar2 - (g_00->gc).total);
    L_local = (lua_State *)0xa;
    break;
  case '\x04':
    GVar2 = (g_00->gc).total;
    pGVar3 = gc_sweep(g_00,(GCRef *)(g_00->gc).sweep.ptr64,0x28);
    (g_00->gc).sweep.ptr64 = (uint64_t)pGVar3;
    (g_00->gc).estimate = (g_00->gc).estimate - (GVar2 - (g_00->gc).total);
    if (*(long *)(g_00->gc).sweep.ptr64 == 0) {
      if (((g_00->str).num <= (g_00->str).mask >> 2) && (0x1ff < (g_00->str).mask)) {
        lj_str_resize(L,(g_00->str).mask >> 1);
      }
      if ((g_00->gc).mmudata.gcptr64 == 0) {
        (g_00->gc).state = '\0';
        (g_00->gc).debt = 0;
      }
      else {
        (g_00->gc).state = '\x05';
        (g_00->gc).nocdatafin = '\x01';
      }
    }
    L_local = (lua_State *)0x190;
    break;
  case '\x05':
    if ((g_00->gc).mmudata.gcptr64 == 0) {
      if ((g_00->gc).nocdatafin == '\0') {
        lj_tab_rehash(L,*(GCtab **)((g_00->ctype_state).ptr64 + 0x20));
      }
      (g_00->gc).state = '\0';
      (g_00->gc).debt = 0;
      L_local = (lua_State *)0x0;
    }
    else if ((g_00->jit_base).ptr64 == 0) {
      gc_finalize(L);
      if (100 < (g_00->gc).estimate) {
        (g_00->gc).estimate = (g_00->gc).estimate - 100;
      }
      L_local = (lua_State *)0x64;
    }
    else {
      L_local = (lua_State *)0x800000000000;
    }
    break;
  default:
    L_local = (lua_State *)0x0;
  }
  return (size_t)L_local;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (tvref(g->jit_base))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
    return 0;
  case GCSsweepstring: {
    GCSize old = g->gc.total;
    gc_sweepstr(g, &g->str.tab[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->str.mask)
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    GCSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      if (g->str.num <= (g->str.mask >> 2) && g->str.mask > LJ_MIN_STRTAB*2-1)
	lj_str_resize(L, g->str.mask >> 1);  /* Shrink string table. */
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (tvref(g->jit_base))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, ctype_ctsG(g)->finalizer);
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lj_assertG(0, "bad GC state");
    return 0;
  }
}